

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::initializeMapBuilder
          (CommonCore *this,string_view request,uint16_t index,QueryReuse reuse,bool force_ordering)

{
  _Tuple_impl<2UL,_helics::QueryReuse> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  json_value jVar3;
  FedInfo **ppFVar4;
  pointer ppVar5;
  pointer pcVar6;
  BaseTimeCoordinator *pBVar7;
  ulong uVar8;
  size_type sVar9;
  CommonCore *pCVar10;
  FederateStates FVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *this_00;
  reference pvVar15;
  int extraout_var;
  FedInfo **ppFVar16;
  string *psVar17;
  value_t vVar18;
  undefined6 in_register_0000000a;
  long lVar19;
  action_t startingAction;
  FedInfo **ppFVar20;
  string *this_01;
  _Alloc_hider _Var21;
  pointer ppVar22;
  FedInfo *pFVar23;
  GlobalFederateId *dep;
  JsonMapBuilder *this_02;
  ulong uVar24;
  string_view queryStr;
  string_view queryStr_00;
  string_view queryStr_01;
  string_view queryStr_02;
  string ret;
  ActionMessage queryReq;
  string local_228;
  size_t local_208;
  JsonMapBuilder *local_200;
  CommonCore *local_1f8;
  byte *local_1f0;
  uint local_1e4;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_1e0;
  uint local_1d4;
  FedInfo **local_1d0;
  data local_1c8;
  string local_1b8;
  ulong local_190;
  data local_188;
  key_type local_178;
  data local_158;
  data local_148;
  data local_138;
  data local_128;
  data local_118;
  data local_108;
  data local_f8;
  ActionMessage local_e8;
  
  local_1f0 = (byte *)request._M_str;
  local_208 = request._M_len;
  this_01 = &local_228;
  uVar8 = (ulong)index;
  uVar14 = (uint)index;
  if ((((uint)(*(int *)&(this->mapBuilders).
                        super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
              *(int *)&(this->mapBuilders).
                       super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555 & 0xffff) <=
      (uint)CONCAT62(in_register_0000000a,index)) {
    std::
    vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
    ::resize(&this->mapBuilders,uVar8 + 1);
  }
  p_Var1 = &(((this->mapBuilders).
              super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            ).
            super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
            .super__Tuple_impl<2UL,_helics::QueryReuse> + uVar14 * 0x60;
  this_02 = (JsonMapBuilder *)(p_Var1 + 0x20);
  (p_Var1->super__Head_base<2UL,_helics::QueryReuse,_false>)._M_head_impl = reuse;
  fileops::JsonMapBuilder::reset(this_02);
  local_200 = this_02;
  this_00 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)fileops::JsonMapBuilder::getJValue_abi_cxx11_(this_02);
  BrokerBase::addBaseInformation(&this->super_BrokerBase,(json *)this_00,true);
  startingAction = cmd_query;
  if (force_ordering) {
    startingAction = cmd_query_ordered;
  }
  ActionMessage::ActionMessage(&local_e8,startingAction);
  if (index == 8) {
    ActionMessage::setAction(&local_e8,cmd_query_ordered);
  }
  if (local_e8.payload.heap == local_1f0) {
    local_e8.payload.bufferSize = local_208;
  }
  else {
    SmallBuffer::reserve(&local_e8.payload,local_208);
    local_e8.payload.bufferSize = local_208;
    if (local_208 != 0) {
      memcpy(local_e8.payload.heap,local_1f0,local_208);
    }
  }
  local_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  local_e8.counter = index;
  if ((((this->loopFederates).dataStorage.csize != 0) || (this->filterFed != (FilterFederate *)0x0))
     || (this->translatorFed != (TranslatorFederate *)0x0)) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_f8,(initializer_list_t)ZEXT816(0),false,array);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"federates");
    vVar18 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_f8.m_type;
    jVar3 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_f8.m_value;
    local_f8.m_type = vVar18;
    local_f8.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_f8);
    if ((this->loopFederates).dataStorage.csize == 0) {
      uVar24 = (ulong)(this->loopFederates).dataStorage.bsize;
      ppFVar16 = (this->loopFederates).dataStorage.dataptr;
      if (uVar24 == 0x20) {
        if (ppFVar16 == (FedInfo **)0x0) {
          ppFVar16 = &gmlc::containers::
                      StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
                      ::emptyValue;
        }
        else {
          ppFVar16 = ppFVar16 + (long)(this->loopFederates).dataStorage.dataSlotIndex + 1;
        }
        goto LAB_002fec03;
      }
      ppFVar16 = ppFVar16 + (this->loopFederates).dataStorage.dataSlotIndex;
      pFVar23 = *ppFVar16 + uVar24;
    }
    else {
      ppFVar16 = (this->loopFederates).dataStorage.dataptr;
LAB_002fec03:
      pFVar23 = *ppFVar16;
      uVar24 = 0;
    }
    uVar14 = (this->loopFederates).dataStorage.bsize;
    ppFVar4 = (this->loopFederates).dataStorage.dataptr;
    lVar19 = (long)(this->loopFederates).dataStorage.dataSlotIndex;
    if (ppFVar4 == (FedInfo **)0x0) {
      ppFVar20 = &gmlc::containers::
                  StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end::
                  emptyValue;
    }
    else {
      ppFVar20 = ppFVar4 + lVar19 + 1;
    }
    local_1d0 = ppFVar4 + lVar19;
    if (uVar14 == 0x20) {
      local_1d0 = ppFVar20;
    }
    local_1d4 = 0;
    if (uVar14 != 0x20) {
      local_1d4 = uVar14;
    }
    local_1f8 = this;
    local_1e0 = this_00;
    local_190 = uVar8;
    if (((uint)uVar24 != local_1d4) || (ppFVar16 != local_1d0)) {
      local_1e4 = (uint)force_ordering;
      do {
        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"federates","");
        iVar12 = fileops::JsonMapBuilder::generatePlaceHolder
                           (local_200,&local_228,(pFVar23->fed->global_id)._M_i.gid);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        queryStr_01._M_str = (char *)local_1f0;
        queryStr_01._M_len = local_208;
        federateQuery_abi_cxx11_(&local_228,local_1f8,pFVar23->fed,queryStr_01,SUB41(local_1e4,0));
        iVar13 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_228,"#wait");
        if (iVar13 == 0) {
          FVar11 = FederateState::getState(pFVar23->fed);
          if (FVar11 < TERMINATING) {
            local_e8.dest_id.gid = (pFVar23->fed->global_id)._M_i.gid;
            local_e8.messageID = iVar12;
            FederateState::addAction(pFVar23->fed,&local_e8);
          }
          else {
            queryStr_02._M_str = "global_state";
            queryStr_02._M_len = 0xc;
            federateQuery_abi_cxx11_
                      (&local_1b8,local_1f8,pFVar23->fed,queryStr_02,SUB41(local_1e4,0));
            fileops::JsonMapBuilder::addComponent(local_200,&local_1b8,iVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        else {
          fileops::JsonMapBuilder::addComponent(local_200,&local_228,iVar12);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        iVar12 = (int)uVar24;
        uVar14 = iVar12 + 1;
        if (iVar12 < 0x1f) {
          pFVar23 = pFVar23 + 1;
        }
        else {
          ppFVar16 = ppFVar16 + (ulong)(iVar12 - 0x1fU >> 5) + 1;
          uVar14 = uVar14 & 0x1f;
          pFVar23 = (FedInfo *)((long)&(*ppFVar16)->fed + (ulong)(uVar14 << 4));
        }
        uVar24 = (ulong)uVar14;
      } while ((uVar14 != local_1d4) || (ppFVar16 != local_1d0));
    }
    this_00 = local_1e0;
    this = local_1f8;
    uVar14 = (uint)local_190;
    if (local_1f8->filterFed != (FilterFederate *)0x0) {
      paVar2 = &local_228.field_2;
      local_228._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"federates","");
      iVar12 = fileops::JsonMapBuilder::generatePlaceHolder
                         (local_200,&local_228,(this->filterFedID)._M_i.gid);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      queryStr._M_str = (char *)local_1f0;
      queryStr._M_len = local_208;
      FilterFederate::query_abi_cxx11_(&local_228,this->filterFed,queryStr);
      fileops::JsonMapBuilder::addComponent(local_200,&local_228,iVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
    }
    if (this->translatorFed != (TranslatorFederate *)0x0) {
      paVar2 = &local_228.field_2;
      local_228._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"federates","");
      iVar12 = fileops::JsonMapBuilder::generatePlaceHolder
                         (local_200,&local_228,(this->translatorFedID)._M_i.gid);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      queryStr_00._M_str = (char *)local_1f0;
      queryStr_00._M_len = local_208;
      TranslatorFederate::query_abi_cxx11_(&local_228,this->translatorFed,queryStr_00);
      fileops::JsonMapBuilder::addComponent(local_200,&local_228,iVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != paVar2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
    }
  }
  switch(uVar14) {
  case 2:
  case 9:
    if ((this->super_BrokerBase).hasTimeDependency != true) break;
    iVar12 = (*((this->super_BrokerBase).timeCoord._M_t.
                super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                ._M_t.
                super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
               _vptr_BaseTimeCoordinator[0xd])();
    lVar19 = (CONCAT44(extraout_var,iVar12) / 1000000000 + ((long)extraout_var >> 0x1f)) -
             ((long)extraout_var >> 0x1f);
    local_158.m_type = null;
    local_158._1_7_ = 0;
    local_158.m_value.object = (object_t *)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
    construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_158,
               (double)(CONCAT44(extraout_var,iVar12) + lVar19 * -1000000000) * 1e-09 +
               (double)lVar19);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"next_time");
    vVar18 = (pvVar15->m_data).m_type;
    this_01 = (string *)&local_158;
    goto LAB_002ff33f;
  case 3:
    if ((this->super_BrokerBase).hasTimeDependency == true) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_108,(initializer_list_t)ZEXT816(0),false,array);
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"dependents");
      vVar18 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_108.m_type;
      jVar3 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value = local_108.m_value;
      local_108.m_type = vVar18;
      local_108.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_108);
      local_1f8 = this;
      BaseTimeCoordinator::getDependents
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_228,
                 (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      sVar9 = local_228._M_string_length;
      if (local_228._M_dataplus._M_p != (pointer)local_228._M_string_length) {
        _Var21._M_p = local_228._M_dataplus._M_p;
        do {
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(this_00,"dependents");
          local_1b8._M_dataplus._M_p = (pointer)0x0;
          local_1b8._M_string_length = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1b8,(long)*(int *)_Var21._M_p);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_1b8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1b8);
          _Var21._M_p = _Var21._M_p + 4;
        } while (_Var21._M_p != (pointer)sVar9);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_228._M_dataplus._M_p,
                        local_228.field_2._M_allocated_capacity - (long)local_228._M_dataplus._M_p);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_118,(initializer_list_t)ZEXT816(0),false,array);
      pCVar10 = local_1f8;
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"dependencies");
      vVar18 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_118.m_type;
      jVar3 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value = local_118.m_value;
      local_118.m_type = vVar18;
      local_118.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_118);
      BaseTimeCoordinator::getDependencies
                ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)
                 &local_228,
                 (pCVar10->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
      if (local_228._M_dataplus._M_p != (pointer)local_228._M_string_length) {
        _Var21._M_p = local_228._M_dataplus._M_p;
        do {
          pvVar15 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(this_00,"dependencies");
          local_1b8._M_dataplus._M_p = (pointer)0x0;
          local_1b8._M_string_length = 0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1b8,(long)*(int *)_Var21._M_p);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar15,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)&local_1b8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&local_1b8);
          _Var21._M_p = _Var21._M_p + 4;
        } while (_Var21._M_p != (pointer)local_228._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_228._M_dataplus._M_p,
                        local_228.field_2._M_allocated_capacity - (long)local_228._M_dataplus._M_p);
      }
    }
    break;
  case 6:
    psVar17 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_128,psVar17);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"state");
    vVar18 = (pvVar15->m_data).m_type;
    this_01 = (string *)&local_128;
LAB_002ff33f:
    (pvVar15->m_data).m_type = ((data *)this_01)->m_type;
    ((data *)this_01)->m_type = vVar18;
    jVar3 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = ((data *)this_01)->m_value;
    ((data *)this_01)->m_value = jVar3;
LAB_002ff355:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data((data *)this_01);
    break;
  case 7:
    psVar17 = brokerStateName_abi_cxx11_((this->super_BrokerBase).brokerState._M_i);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_138,psVar17);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(this_00,"state");
    vVar18 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_138.m_type;
    jVar3 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_138.m_value;
    local_138.m_type = vVar18;
    local_138.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_138);
    pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    if ((pBVar7 != (BaseTimeCoordinator *)0x0) &&
       (*(pointer *)
         &(pBVar7->dependencies).dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> !=
        (pBVar7->dependencies).dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      local_188.m_type = null;
      local_188.m_value.object = (object_t *)0x0;
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"time");
      vVar18 = (pvVar15->m_data).m_type;
      (pvVar15->m_data).m_type = local_188.m_type;
      jVar3 = (pvVar15->m_data).m_value;
      (pvVar15->m_data).m_value.object = (object_t *)local_188.m_value;
      local_188.m_type = vVar18;
      local_188.m_value = jVar3;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_188);
      pBVar7 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      pvVar15 = nlohmann::json_abi_v3_11_3::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                ::operator[]<char_const>(this_00,"time");
      (*pBVar7->_vptr_BaseTimeCoordinator[0xc])(pBVar7,pvVar15);
    }
    break;
  case 0xe:
    if ((this->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->tags).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    local_1e0 = this_00;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_228,(initializer_list_t)ZEXT816(0),false,object);
    ppVar22 = (this->tags).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (this->tags).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar22 != ppVar5) {
      do {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1c8,&ppVar22->second);
        pcVar6 = (ppVar22->first)._M_dataplus._M_p;
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,pcVar6,pcVar6 + (ppVar22->first)._M_string_length);
        pvVar15 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_228,&local_178);
        vVar18 = (pvVar15->m_data).m_type;
        (pvVar15->m_data).m_type = local_1c8.m_type;
        jVar3 = (pvVar15->m_data).m_value;
        (pvVar15->m_data).m_value = local_1c8.m_value;
        local_1c8.m_type = vVar18;
        local_1c8.m_value = jVar3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1c8);
        ppVar22 = ppVar22 + 1;
      } while (ppVar22 != ppVar5);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_148,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_228);
    pvVar15 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(local_1e0,"tags");
    vVar18 = (pvVar15->m_data).m_type;
    (pvVar15->m_data).m_type = local_148.m_type;
    jVar3 = (pvVar15->m_data).m_value;
    (pvVar15->m_data).m_value = local_148.m_value;
    local_148.m_type = vVar18;
    local_148.m_value = jVar3;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&local_148);
    goto LAB_002ff355;
  }
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CommonCore::initializeMapBuilder(std::string_view request,
                                      std::uint16_t index,
                                      QueryReuse reuse,
                                      bool force_ordering) const
{
    if (!isValidIndex(index, mapBuilders)) {
        mapBuilders.resize(static_cast<size_t>(index) + 1);
    }
    std::get<2>(mapBuilders[index]) = reuse;
    auto& builder = std::get<0>(mapBuilders[index]);
    builder.reset();
    nlohmann::json& base = builder.getJValue();
    addBaseInformation(base, true);
    ActionMessage queryReq(force_ordering ? CMD_QUERY_ORDERED : CMD_QUERY);
    if (index == GLOBAL_FLUSH) {
        queryReq.setAction(CMD_QUERY_ORDERED);
    }
    queryReq.payload = request;
    queryReq.source_id = global_broker_id_local;
    queryReq.counter = index;  // indicating which processing to use
    if (loopFederates.size() > 0 || filterFed != nullptr || translatorFed != nullptr) {
        base["federates"] = nlohmann::json::array();
        for (const auto& fed : loopFederates) {
            const int brkindex =
                builder.generatePlaceHolder("federates", fed->global_id.load().baseValue());
            const std::string ret = federateQuery(fed.fed, request, force_ordering);
            if (ret == "#wait") {
                if (fed->getState() <= FederateStates::EXECUTING) {
                    queryReq.messageID = brkindex;
                    queryReq.dest_id = fed.fed->global_id;
                    fed.fed->addAction(queryReq);
                } else {
                    // the federate has terminated or errored so is waiting, global_state doesn't
                    // block
                    builder.addComponent(federateQuery(fed.fed, "global_state", force_ordering),
                                         brkindex);
                }
            } else {
                builder.addComponent(ret, brkindex);
            }
        }
        if (filterFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", filterFedID.load().baseValue());
            const std::string ret = filterFed->query(request);
            builder.addComponent(ret, brkindex);
        }
        if (translatorFed != nullptr) {
            const int brkindex =
                builder.generatePlaceHolder("federates", translatorFedID.load().baseValue());
            const std::string ret = translatorFed->query(request);
            builder.addComponent(ret, brkindex);
        }
    }

    switch (index) {
        case CURRENT_TIME_MAP:
        case GLOBAL_STATUS:
            if (hasTimeDependency) {
                base["next_time"] = static_cast<double>(timeCoord->getNextTime());
            }
            break;
        case DEPENDENCY_GRAPH: {
            if (hasTimeDependency) {
                base["dependents"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependents()) {
                    base["dependents"].push_back(dep.baseValue());
                }
                base["dependencies"] = nlohmann::json::array();
                for (const auto& dep : timeCoord->getDependencies()) {
                    base["dependencies"].push_back(dep.baseValue());
                }
            }
        } break;
        case GLOBAL_STATE:
            base["state"] = brokerStateName(getBrokerState());
            break;
        case GLOBAL_TIME_DEBUGGING:
            base["state"] = brokerStateName(getBrokerState());
            if (timeCoord && !timeCoord->empty()) {
                base["time"] = nlohmann::json();
                timeCoord->generateDebuggingTimeInfo(base["time"]);
            }
            break;
        case UNCONNECTED_INTERFACES:
            if (!tags.empty()) {
                nlohmann::json tagBlock = nlohmann::json::object();
                for (const auto& tag : tags) {
                    tagBlock[tag.first] = tag.second;
                }
                base["tags"] = tagBlock;
            }
            break;
        default:
            break;
    }
}